

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_small_window.cc
# Opt level: O0

void __thiscall small_window_basic_Test::TestBody(small_window_basic_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  int iVar6;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  uchar plain_again [128];
  uint compr_len;
  uchar compr [128];
  size_t i;
  uchar dictionary1 [448];
  uchar plain [128];
  int err;
  zng_stream stream;
  zng_stream *in_stack_fffffffffffff928;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffff930;
  undefined1 in_stack_fffffffffffff937;
  int *in_stack_fffffffffffff938;
  uint8_t *in_stack_fffffffffffff940;
  AssertionResult *pAVar7;
  int32_t in_stack_fffffffffffff948;
  uint32_t in_stack_fffffffffffff94c;
  int line;
  uint8_t *in_stack_fffffffffffff950;
  zng_stream *in_stack_fffffffffffff958;
  Type TVar8;
  undefined7 in_stack_fffffffffffff960;
  undefined1 in_stack_fffffffffffff967;
  undefined8 in_stack_fffffffffffff970;
  int32_t flush;
  undefined7 in_stack_fffffffffffff978;
  undefined1 in_stack_fffffffffffff97f;
  undefined7 in_stack_fffffffffffff990;
  char *in_stack_fffffffffffff998;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffff9a8;
  undefined1 in_stack_fffffffffffff9af;
  AssertHelper *in_stack_fffffffffffff9b0;
  undefined4 in_stack_fffffffffffff9f4;
  int32_t flush_00;
  zng_stream *in_stack_fffffffffffff9f8;
  string local_5d0 [55];
  undefined1 local_599;
  AssertionResult local_598 [2];
  undefined4 local_574;
  AssertionResult local_570 [2];
  undefined4 local_54c;
  AssertionResult local_548 [2];
  undefined4 local_524;
  AssertionResult local_520 [2];
  undefined4 local_4fc;
  AssertionResult local_4f8 [2];
  undefined4 local_4d4;
  AssertionResult local_4d0 [2];
  undefined4 local_4ac;
  AssertionResult local_4a8 [2];
  undefined4 local_484;
  AssertionResult local_480 [2];
  undefined4 local_45c;
  AssertionResult local_458 [2];
  undefined4 local_434;
  AssertionResult local_430 [3];
  undefined4 local_3fc;
  AssertionResult local_3f8;
  undefined1 local_3e8 [140];
  int local_35c;
  undefined1 local_358 [136];
  ulong local_2d0;
  undefined1 local_2c8 [448];
  undefined1 local_108 [140];
  int32_t local_7c;
  undefined1 *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined1 *puStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  flush = (int32_t)((ulong)in_stack_fffffffffffff970 >> 0x20);
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  puStack_60 = (undefined1 *)0x0;
  local_78 = (undefined1 *)0x0;
  uStack_70 = 0;
  local_18 = 0;
  local_7c = zng_deflateInit2(in_stack_fffffffffffff958,
                              (int32_t)((ulong)in_stack_fffffffffffff950 >> 0x20),
                              (int32_t)in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
                              in_stack_fffffffffffff948,
                              (int32_t)((ulong)in_stack_fffffffffffff940 >> 0x20));
  local_3fc = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
             (char *)in_stack_fffffffffffff940,in_stack_fffffffffffff938,
             (int *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3f8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
    testing::AssertionResult::failure_message((AssertionResult *)0x13a3c3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
               (Type)((ulong)in_stack_fffffffffffff958 >> 0x20),(char *)in_stack_fffffffffffff950,
               in_stack_fffffffffffff94c,(char *)in_stack_fffffffffffff940);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff9b0,
               (Message *)CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    testing::Message::~Message((Message *)0x13a426);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13a47e);
  memset(local_2c8,0x61,0x1c0);
  local_7c = zng_deflateSetDictionary
                       (in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                        in_stack_fffffffffffff94c);
  local_434 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
             (char *)in_stack_fffffffffffff940,in_stack_fffffffffffff938,
             (int *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_430);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
    in_stack_fffffffffffff9f8 =
         (zng_stream *)testing::AssertionResult::failure_message((AssertionResult *)0x13a56b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
               (Type)((ulong)in_stack_fffffffffffff958 >> 0x20),(char *)in_stack_fffffffffffff950,
               in_stack_fffffffffffff94c,(char *)in_stack_fffffffffffff940);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff9b0,
               (Message *)CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    testing::Message::~Message((Message *)0x13a5ce);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13a623);
  for (local_2d0 = 0; local_2d0 < 0x80; local_2d0 = local_2d0 + 1) {
    local_108[local_2d0] = (char)local_2d0;
  }
  local_7c = zng_deflateSetDictionary
                       (in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                        in_stack_fffffffffffff94c);
  TVar8 = (Type)((ulong)in_stack_fffffffffffff958 >> 0x20);
  local_45c = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
             (char *)in_stack_fffffffffffff940,in_stack_fffffffffffff938,
             (int *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_458);
  flush_00 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff9f4);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
    testing::AssertionResult::failure_message((AssertionResult *)0x13a73a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),TVar8,
               (char *)in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
               (char *)in_stack_fffffffffffff940);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff9b0,
               (Message *)CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    testing::Message::~Message((Message *)0x13a79d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13a7f5);
  local_78 = local_108;
  uStack_70 = CONCAT44(uStack_70._4_4_,0x80);
  puStack_60 = local_358;
  local_58 = CONCAT44(local_58._4_4_,0x80);
  local_7c = zng_deflate((zng_stream *)CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978)
                         ,flush);
  local_484 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
             (char *)in_stack_fffffffffffff940,in_stack_fffffffffffff938,
             (int *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_480);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
    testing::AssertionResult::failure_message((AssertionResult *)0x13a8f1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),TVar8,
               (char *)in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
               (char *)in_stack_fffffffffffff940);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff9b0,
               (Message *)CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    testing::Message::~Message((Message *)0x13a954);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13a9ac);
  local_35c = 0x80 - (int)local_58;
  local_7c = zng_deflateEnd(in_stack_fffffffffffff928);
  local_4ac = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
             (char *)in_stack_fffffffffffff940,in_stack_fffffffffffff938,
             (int *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4a8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
    in_stack_fffffffffffff9b0 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x13aa82);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),TVar8,
               (char *)in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
               (char *)in_stack_fffffffffffff940);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff9b0,
               (Message *)CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    testing::Message::~Message((Message *)0x13aae5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13ab3d);
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  puStack_60 = (undefined1 *)0x0;
  local_78 = (undefined1 *)0x0;
  uStack_70 = 0;
  local_18 = 0;
  local_7c = zng_inflateInit2((zng_stream *)
                              CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                              (int32_t)((ulong)in_stack_fffffffffffff940 >> 0x20));
  local_4d4 = 0;
  this_01 = local_4d0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
             (char *)in_stack_fffffffffffff940,in_stack_fffffffffffff938,
             (int *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!(bool)uVar2) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
    in_stack_fffffffffffff998 =
         testing::AssertionResult::failure_message((AssertionResult *)0x13ac3c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),TVar8,
               (char *)in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
               (char *)in_stack_fffffffffffff940);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff9b0,(Message *)CONCAT17(uVar2,in_stack_fffffffffffff9a8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    testing::Message::~Message((Message *)0x13ac99);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13acf1);
  local_7c = zng_inflateSetDictionary
                       ((zng_stream *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                        in_stack_fffffffffffff940,
                        (uint32_t)((ulong)in_stack_fffffffffffff938 >> 0x20));
  local_4fc = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
             (char *)in_stack_fffffffffffff940,in_stack_fffffffffffff938,
             (int *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  uVar3 = testing::AssertionResult::operator_cast_to_bool(local_4f8);
  if (!(bool)uVar3) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
    testing::AssertionResult::failure_message((AssertionResult *)0x13adb3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),TVar8,
               (char *)in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
               (char *)in_stack_fffffffffffff940);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff9b0,(Message *)CONCAT17(uVar2,in_stack_fffffffffffff9a8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    testing::Message::~Message((Message *)0x13ae10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13ae68);
  local_7c = zng_inflateSetDictionary
                       ((zng_stream *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                        in_stack_fffffffffffff940,
                        (uint32_t)((ulong)in_stack_fffffffffffff938 >> 0x20));
  local_524 = 0;
  pAVar7 = local_520;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
             (char *)in_stack_fffffffffffff940,in_stack_fffffffffffff938,
             (int *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
    testing::AssertionResult::failure_message((AssertionResult *)0x13af2a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),TVar8,
               (char *)in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
               (char *)in_stack_fffffffffffff940);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff9b0,(Message *)CONCAT17(uVar2,in_stack_fffffffffffff9a8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    testing::Message::~Message((Message *)0x13af87);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13afdf);
  local_78 = local_358;
  uStack_70 = CONCAT44(uStack_70._4_4_,local_35c);
  puStack_60 = local_3e8;
  local_58 = CONCAT44(local_58._4_4_,0x80);
  local_7c = zng_inflate(in_stack_fffffffffffff9f8,flush_00);
  local_54c = 1;
  pAVar7 = local_548;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
             (char *)in_stack_fffffffffffff940,in_stack_fffffffffffff938,
             (int *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  uVar4 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
  TVar8 = (Type)((ulong)pAVar7 >> 0x20);
  if (!(bool)uVar4) {
    testing::Message::Message((Message *)CONCAT17(uVar4,in_stack_fffffffffffff960));
    in_stack_fffffffffffff950 =
         (uint8_t *)testing::AssertionResult::failure_message((AssertionResult *)0x13b0cf);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffff960),TVar8,
               (char *)in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
               (char *)in_stack_fffffffffffff940);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff9b0,(Message *)CONCAT17(uVar2,in_stack_fffffffffffff9a8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    testing::Message::~Message((Message *)0x13b12c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13b181);
  local_7c = zng_inflateEnd(in_stack_fffffffffffff928);
  local_574 = 0;
  pAVar7 = local_570;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),&pAVar7->success_
             ,in_stack_fffffffffffff938,
             (int *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffff94c);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar4,in_stack_fffffffffffff960));
    testing::AssertionResult::failure_message((AssertionResult *)0x13b236);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffff960),TVar8,
               (char *)in_stack_fffffffffffff950,line,&pAVar7->success_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff9b0,(Message *)CONCAT17(uVar2,in_stack_fffffffffffff9a8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    testing::Message::~Message((Message *)0x13b293);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13b2e8);
  iVar6 = memcmp(local_3e8,local_108,0x80);
  local_599 = iVar6 == 0;
  this_00 = local_598;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
             &this_00->success_,(type *)0x13b329);
  uVar5 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!(bool)uVar5) {
    testing::Message::Message((Message *)CONCAT17(uVar4,in_stack_fffffffffffff960));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(uVar2,in_stack_fffffffffffff9a8),&this_01->success_,
               in_stack_fffffffffffff998,(char *)CONCAT17(uVar3,in_stack_fffffffffffff990));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffff960),TVar8,
               (char *)in_stack_fffffffffffff950,line,&pAVar7->success_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff9b0,(Message *)CONCAT17(uVar2,in_stack_fffffffffffff9a8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar5,in_stack_fffffffffffff930));
    std::__cxx11::string::~string(local_5d0);
    testing::Message::~Message((Message *)0x13b41b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13b493);
  return;
}

Assistant:

TEST(small_window, basic) {
    PREFIX3(stream) stream;
    int err;
    unsigned char plain[128];
    unsigned char dictionary1[(1 << 9) - sizeof(plain) / 2];
    size_t i;
    unsigned char compr[sizeof(plain)];
    unsigned int compr_len;
    unsigned char plain_again[sizeof(plain)];

    memset(&stream, 0, sizeof(stream));
    err = PREFIX(deflateInit2)(&stream, Z_BEST_COMPRESSION, Z_DEFLATED, -9, 8, Z_DEFAULT_STRATEGY);
    EXPECT_EQ(err, Z_OK);

    /* Use a large dictionary that is loaded in two parts */
    memset(dictionary1, 'a', sizeof(dictionary1));
    err = PREFIX(deflateSetDictionary)(&stream, dictionary1, (unsigned int)sizeof(dictionary1));
    EXPECT_EQ(err, Z_OK);
    for (i = 0; i < sizeof(plain); i++)
        plain[i] = (unsigned char)i;
    err = PREFIX(deflateSetDictionary)(&stream, plain, (unsigned int)sizeof(plain));
    EXPECT_EQ(err, Z_OK);

    stream.next_in = plain;
    stream.avail_in = (uint32_t)sizeof(plain);
    stream.next_out = compr;
    stream.avail_out = (uint32_t)sizeof(compr);
    err = PREFIX(deflate)(&stream, Z_FINISH);
    EXPECT_EQ(err, Z_STREAM_END);
    compr_len = sizeof(compr) - stream.avail_out;

    err = PREFIX(deflateEnd)(&stream);
    EXPECT_EQ(err, Z_OK);

    memset(&stream, 0, sizeof(stream));
    err = PREFIX(inflateInit2)(&stream, -9);
    EXPECT_EQ(err, Z_OK);

    err = PREFIX(inflateSetDictionary)(&stream, dictionary1, (unsigned int)sizeof(dictionary1));
    EXPECT_EQ(err, Z_OK);
    err = PREFIX(inflateSetDictionary)(&stream, plain, (unsigned int)sizeof(plain));
    EXPECT_EQ(err, Z_OK);

    stream.next_in = compr;
    stream.avail_in = compr_len;
    stream.next_out = plain_again;
    stream.avail_out = (unsigned int)sizeof(plain_again);

    err = PREFIX(inflate)(&stream, Z_NO_FLUSH);
    EXPECT_EQ(err, Z_STREAM_END);

    err = PREFIX(inflateEnd)(&stream);
    EXPECT_EQ(err, Z_OK);

    EXPECT_TRUE(memcmp(plain_again, plain, sizeof(plain)) == 0);
}